

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O0

Image * denoiseImage(Image *in,ImageChannelDesc *Ldesc,Image *varianceImage,
                    ImageChannelDesc *albedoDesc,ImageChannelDesc *zDesc,
                    ImageChannelDesc *deltaZDesc,ImageChannelDesc *nDesc,int halfWidth,int nLevels)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  Point2i p;
  Point2i p_00;
  WrapMode2D wrapMode;
  Point2i p_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  Point2i p_02;
  Point2i p_03;
  reference pvVar1;
  Point2i PVar2;
  WrapMode in_RSI [2];
  Image *in_RDI;
  Tuple2<pbrt::Point2,_int> p_04;
  Image *in_R8;
  float fVar3;
  int in_stack_00000018;
  int in_stack_00000020;
  int c_1;
  ImageChannelValues albedo_1;
  int x_1;
  int y_1;
  Image filtered;
  int delta;
  int i_1;
  int i;
  vector<float,_std::allocator<float>_> f;
  int c;
  ImageChannelValues L;
  ImageChannelValues albedo;
  int x;
  int y;
  Image illum;
  Image *currentImage;
  nullptr_t in_stack_fffffffffffff888;
  nullptr_t index;
  Image *in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff898;
  Float in_stack_fffffffffffff89c;
  float in_stack_fffffffffffff8a0;
  float in_stack_fffffffffffff8a4;
  size_type in_stack_fffffffffffff8a8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8bc;
  int iVar4;
  Image *in_stack_fffffffffffff8c0;
  undefined4 in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8d0;
  long in_stack_fffffffffffff900;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff908;
  int in_stack_fffffffffffff910;
  int in_stack_fffffffffffff914;
  int in_stack_fffffffffffff918;
  int in_stack_fffffffffffff91c;
  Tuple2<pbrt::Point2,_int> TVar5;
  int in_stack_fffffffffffff920;
  function<void_(long,_long)> *func;
  undefined4 in_stack_fffffffffffff978;
  int in_stack_fffffffffffff97c;
  reference in_stack_fffffffffffff980;
  ColorEncodingHandle *in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  PixelFormat in_stack_fffffffffffff9ac;
  undefined4 in_stack_fffffffffffff9b0;
  value_type in_stack_fffffffffffff9b4;
  Allocator in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c4;
  reference in_stack_fffffffffffff9c8;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff9d0;
  WrapMode in_stack_fffffffffffff9e0 [2];
  Image *in_stack_fffffffffffff9e8;
  array<pbrt::WrapMode,_2> in_stack_fffffffffffff9f0;
  int in_stack_fffffffffffff9f8;
  int in_stack_fffffffffffff9fc;
  string *local_5d8;
  float local_574;
  int local_530;
  int local_528;
  int iStack_520;
  int local_51c;
  int iStack_4a4;
  nullptr_t local_4a0;
  allocator<char> local_48b;
  allocator<char> local_48a;
  allocator<char> local_489;
  undefined1 *local_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 *local_420;
  undefined8 local_418;
  Tuple2<pbrt::Point2,_int> local_400;
  int local_2e0;
  uint local_2dc;
  undefined1 local_2d5;
  int local_2d4;
  function<void_(long,_long)> local_2cd;
  int local_29c;
  Tuple2<pbrt::Point2,_int> local_218;
  int local_210;
  Tuple2<pbrt::Point2,_int> local_20c;
  int local_204;
  nullptr_t local_200;
  undefined1 local_1ef;
  allocator<char> local_1ee;
  allocator<char> local_1ed [20];
  allocator<char> local_1d9;
  string *local_1d8;
  string local_1d0 [32];
  undefined1 local_1b0 [32];
  undefined1 local_190 [32];
  string *local_170;
  undefined8 local_168;
  Tuple2<pbrt::Point2,_int> local_150;
  Image *local_28;
  WrapMode local_10 [2];
  
  local_28 = in_R8;
  local_10 = in_RSI;
  local_150 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution((Image *)in_RSI);
  local_1ef = 1;
  local_1d8 = local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8d0,
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
             (allocator<char> *)in_stack_fffffffffffff8c0);
  local_1d8 = (string *)local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8d0,
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
             (allocator<char> *)in_stack_fffffffffffff8c0);
  local_1d8 = (string *)local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8d0,
             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
             (allocator<char> *)in_stack_fffffffffffff8c0);
  local_1ef = 0;
  local_170 = local_1d0;
  local_168 = 3;
  v._M_array._4_4_ = in_stack_fffffffffffff89c;
  v._M_array._0_4_ = in_stack_fffffffffffff898;
  v._M_len._0_4_ = in_stack_fffffffffffff8a0;
  v._M_len._4_4_ = in_stack_fffffffffffff8a4;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff890,v);
  pbrt::ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff890);
  channels.ptr._4_4_ = in_stack_fffffffffffff9c4;
  channels.ptr._0_4_ = in_stack_fffffffffffff9c0;
  channels.n = (size_t)in_stack_fffffffffffff9c8;
  pbrt::Image::Image((Image *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                     in_stack_fffffffffffff9ac,(Point2i)in_stack_fffffffffffff9d0,channels,
                     in_stack_fffffffffffff9a0,in_stack_fffffffffffff9b8);
  local_5d8 = (string *)&local_170;
  index = local_200;
  do {
    local_5d8 = local_5d8 + -0x20;
    std::__cxx11::string::~string(local_5d8);
  } while (local_5d8 != local_1d0);
  std::allocator<char>::~allocator(&local_1ee);
  std::allocator<char>::~allocator(local_1ed);
  std::allocator<char>::~allocator(&local_1d9);
  local_204 = 0;
  while( true ) {
    iVar4 = local_204;
    local_20c = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution((Image *)local_10);
    if (local_20c.y <= iVar4) break;
    local_210 = 0;
    while( true ) {
      in_stack_fffffffffffff9fc = local_210;
      local_218 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution((Image *)local_10);
      if (local_218.x <= in_stack_fffffffffffff9fc) break;
      in_stack_fffffffffffff9f0.values = local_10;
      pbrt::Point2<int>::Point2
                ((Point2<int> *)in_stack_fffffffffffff890,(int)((ulong)index >> 0x20),(int)index);
      in_stack_fffffffffffff9e8 = local_28;
      pbrt::WrapMode2D::WrapMode2D
                ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (WrapMode)in_stack_fffffffffffff89c);
      p_02.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff9fc;
      p_02.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff9f8;
      pbrt::Image::GetChannels
                (in_stack_fffffffffffff9e8,p_02,(ImageChannelDesc *)in_stack_fffffffffffff9e0,
                 (WrapMode2D)in_stack_fffffffffffff9f0.values);
      in_stack_fffffffffffff9e0 = local_10;
      pbrt::Point2<int>::Point2
                ((Point2<int> *)in_stack_fffffffffffff890,(int)((ulong)index >> 0x20),(int)index);
      pbrt::WrapMode2D::WrapMode2D
                ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (WrapMode)in_stack_fffffffffffff89c);
      p_03.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff9fc;
      p_03.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff9f8;
      pbrt::Image::GetChannels
                (in_stack_fffffffffffff9e8,p_03,(ImageChannelDesc *)in_stack_fffffffffffff9e0,
                 (WrapMode2D)in_stack_fffffffffffff9f0.values);
      for (local_29c = 0; local_29c < 3; local_29c = local_29c + 1) {
        in_stack_fffffffffffff9d0 =
             (Tuple2<pbrt::Point2,_int>)
             pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                        in_stack_fffffffffffff890,(size_type)index);
        iVar4 = (int)((ulong)index >> 0x20);
        if (*(float *)in_stack_fffffffffffff9d0 <= 0.0) {
          pbrt::Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff890,iVar4,(int)index);
          in_stack_fffffffffffff97c = local_29c;
          in_stack_fffffffffffff980 =
               pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                          in_stack_fffffffffffff890,(size_type)index);
          p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff914;
          p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff910;
          pbrt::Image::SetChannel
                    ((Image *)in_stack_fffffffffffff908,p_00,
                     (int)((ulong)in_stack_fffffffffffff900 >> 0x20),
                     (Float)in_stack_fffffffffffff900);
        }
        else {
          pbrt::Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff890,iVar4,(int)index);
          in_stack_fffffffffffff9c4 = local_29c;
          in_stack_fffffffffffff9c8 =
               pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                          in_stack_fffffffffffff890,(size_type)index);
          in_stack_fffffffffffff9b4 = *in_stack_fffffffffffff9c8;
          in_stack_fffffffffffff9b8.memoryResource =
               (memory_resource *)
               pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                          in_stack_fffffffffffff890,(size_type)index);
          p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff914;
          p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff910;
          pbrt::Image::SetChannel
                    ((Image *)in_stack_fffffffffffff908,p,
                     (int)((ulong)in_stack_fffffffffffff900 >> 0x20),
                     (Float)in_stack_fffffffffffff900);
        }
      }
      pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3e511e);
      pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3e512b);
      local_210 = local_210 + 1;
    }
    local_204 = local_204 + 1;
  }
  local_2cd.super__Function_base._M_functor._1_4_ = 0;
  func = &local_2cd;
  std::allocator<float>::allocator((allocator<float> *)0x3e519e);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,
             (value_type *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
             (allocator_type *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  std::allocator<float>::~allocator((allocator<float> *)0x3e51d2);
  for (local_2d4 = 0; local_2d4 <= in_stack_00000018; local_2d4 = local_2d4 + 1) {
    fVar3 = pbrt::FastExp(in_stack_fffffffffffff8a0);
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        ((long)&local_2cd.super__Function_base._M_functor + 5),(long)local_2d4);
    *pvVar1 = fVar3;
  }
  denoiseImage::call = denoiseImage::call + 1;
  local_2d5 = 0;
  pbrt::Image::Image(in_stack_fffffffffffff8c0,
                     (Image *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  TVar5.y = in_stack_fffffffffffff91c;
  TVar5.x = in_stack_fffffffffffff918;
  p_04.y = in_stack_fffffffffffff914;
  p_04.x = in_stack_fffffffffffff910;
  for (local_2dc = 0; (int)local_2dc < in_stack_00000020; local_2dc = local_2dc + 1) {
    local_2e0 = 1 << (local_2dc & 0x1f);
    local_400 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution((Image *)local_10);
    local_488 = local_480;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8d0,
               (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
               (allocator<char> *)in_stack_fffffffffffff8c0);
    local_488 = local_460;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8d0,
               (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
               (allocator<char> *)in_stack_fffffffffffff8c0);
    local_488 = local_440;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8d0,
               (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
               (allocator<char> *)in_stack_fffffffffffff8c0);
    local_420 = local_480;
    local_418 = 3;
    v_00._M_array._4_4_ = in_stack_fffffffffffff89c;
    v_00._M_array._0_4_ = in_stack_fffffffffffff898;
    v_00._M_len._0_4_ = in_stack_fffffffffffff8a0;
    v_00._M_len._4_4_ = in_stack_fffffffffffff8a4;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff890,v_00);
    pbrt::ColorEncodingHandle::TaggedPointer((ColorEncodingHandle *)in_stack_fffffffffffff890,index)
    ;
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff890);
    channels_00.ptr._4_4_ = in_stack_fffffffffffff9c4;
    channels_00.ptr._0_4_ = in_stack_fffffffffffff9c0;
    channels_00.n = (size_t)in_stack_fffffffffffff9c8;
    index = local_4a0;
    pbrt::Image::Image((Image *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                       in_stack_fffffffffffff9ac,(Point2i)in_stack_fffffffffffff9d0,channels_00,
                       in_stack_fffffffffffff9a0,in_stack_fffffffffffff9b8);
    TVar5 = (Tuple2<pbrt::Point2,_int>)local_480;
    p_04 = (Tuple2<pbrt::Point2,_int>)&local_420;
    do {
      p_04 = (Tuple2<pbrt::Point2,_int>)((long)p_04 + -0x20);
      std::__cxx11::string::~string((string *)p_04);
      in_stack_fffffffffffff920 = p_04.x;
    } while (p_04 != TVar5);
    std::allocator<char>::~allocator(&local_48b);
    std::allocator<char>::~allocator(&local_48a);
    std::allocator<char>::~allocator(&local_489);
    in_stack_fffffffffffff908 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(in_RDI);
    iStack_4a4 = in_stack_fffffffffffff908.y;
    in_stack_fffffffffffff900 = (long)iStack_4a4;
    std::function<void(long,long)>::
    function<denoiseImage(pbrt::Image_const&,pbrt::ImageChannelDesc_const&,pbrt::Image_const&,pbrt::ImageChannelDesc_const&,pbrt::ImageChannelDesc_const&,pbrt::ImageChannelDesc_const&,pbrt::ImageChannelDesc_const&,int,int)::__0,void>
              ((function<void_(long,_long)> *)
               CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
               (anon_class_80_10_bebad26b *)
               CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    pbrt::ParallelFor((int64_t)in_stack_fffffffffffff980,
                      CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),func);
    std::function<void_(long,_long)>::~function((function<void_(long,_long)> *)0x3e563b);
    pstd::swap<pbrt::Image>
              ((Image *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               (Image *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
    pbrt::Image::~Image(in_stack_fffffffffffff890);
  }
  local_51c = 0;
  while( true ) {
    iVar4 = local_51c;
    PVar2 = pbrt::Image::Resolution(in_RDI);
    iStack_520 = PVar2.super_Tuple2<pbrt::Point2,_int>.y;
    if (iStack_520 <= iVar4) break;
    local_528 = 0;
    while( true ) {
      iVar4 = local_528;
      PVar2 = pbrt::Image::Resolution(in_RDI);
      local_530 = PVar2.super_Tuple2<pbrt::Point2,_int>.x;
      if (local_530 <= iVar4) break;
      pbrt::Point2<int>::Point2
                ((Point2<int> *)in_stack_fffffffffffff890,(int)((ulong)index >> 0x20),(int)index);
      pbrt::WrapMode2D::WrapMode2D
                ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (WrapMode)in_stack_fffffffffffff89c);
      PVar2.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff9fc;
      PVar2.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff9f8;
      pbrt::Image::GetChannels
                (in_stack_fffffffffffff9e8,PVar2,(ImageChannelDesc *)in_stack_fffffffffffff9e0,
                 (WrapMode2D)in_stack_fffffffffffff9f0.values);
      for (local_574 = 0.0; (int)local_574 < 3; local_574 = (float)((int)local_574 + 1)) {
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)in_stack_fffffffffffff890,(int)((ulong)index >> 0x20),(int)index);
        in_stack_fffffffffffff8a4 = local_574;
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)in_stack_fffffffffffff890,(int)((ulong)index >> 0x20),(int)index);
        in_stack_fffffffffffff8a0 = local_574;
        pbrt::WrapMode2D::WrapMode2D
                  ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff8a4,local_574),
                   (WrapMode)in_stack_fffffffffffff89c);
        p_01.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff920;
        p_01.super_Tuple2<pbrt::Point2,_int>.x = TVar5.y;
        wrapMode.wrap.values[1] = TVar5.x;
        wrapMode.wrap.values[0] = p_04.y;
        in_stack_fffffffffffff89c =
             pbrt::Image::GetChannel
                       ((Image *)in_stack_fffffffffffff908,p_01,
                        (int)((ulong)in_stack_fffffffffffff900 >> 0x20),wrapMode);
        in_stack_fffffffffffff890 =
             (Image *)pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                      operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  *)in_stack_fffffffffffff890,(size_type)index);
        pbrt::Image::SetChannel
                  ((Image *)in_stack_fffffffffffff908,(Point2i)p_04,
                   (int)((ulong)in_stack_fffffffffffff900 >> 0x20),(Float)in_stack_fffffffffffff900)
        ;
      }
      pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3e5a2c);
      local_528 = local_528 + 1;
    }
    local_51c = local_51c + 1;
  }
  local_2d5 = 1;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  pbrt::Image::~Image(in_stack_fffffffffffff890);
  return in_RDI;
}

Assistant:

Image denoiseImage(const Image &in, const ImageChannelDesc &Ldesc,
                   const Image &varianceImage, const ImageChannelDesc &albedoDesc,
                   const ImageChannelDesc &zDesc, const ImageChannelDesc &deltaZDesc,
                   const ImageChannelDesc &nDesc, int halfWidth, int nLevels) {
    Image illum(PixelFormat::Float, in.Resolution(), {"R", "G", "B"});
    for (int y = 0; y < in.Resolution().y; ++y)
        for (int x = 0; x < in.Resolution().x; ++x) {
            ImageChannelValues albedo = in.GetChannels({x, y}, albedoDesc);
            ImageChannelValues L = in.GetChannels({x, y}, Ldesc);
            for (int c = 0; c < 3; ++c)
                if (albedo[c] > 0)
                    illum.SetChannel({x, y}, c, L[c] / albedo[c]);
                else
                    illum.SetChannel({x, y}, c, L[c]);
        }

    std::vector<Float> f(halfWidth + 1, 0.);
    for (int i = 0; i <= halfWidth; ++i)
        f[i] = FastExp(-Float(i) / halfWidth * 3.f);

    static int call = -1;
    ++call;

    Image currentImage = std::move(illum);
    for (int i = 0; i < nLevels; ++i) {
        int delta = 1 << i;  // A-Trous step between samples.

        Image filtered(PixelFormat::Float, in.Resolution(), {"R", "G", "B"});
        // Image wImage(PixelFormat::Float, in.Resolution(), 3, "Wp,Wn,Wc");
        // Image dzImage(PixelFormat::Float, in.Resolution(), 1, "Y");

        ParallelFor(0, currentImage.Resolution().y, [&](int64_t start, int64_t end) {
            for (int y = start; y < end; ++y) {
                for (int x = 0; x < currentImage.Resolution().x; ++x) {
                    float wsum = 0;
                    ImageChannelValues c = currentImage.GetChannels({x, y});

                    Float z = in.GetChannels({x, y}, zDesc);
                    // FIXME: hack multiply to cancel out scaled ray
                    // differentials...
                    Float dzdx = 8 * in.GetChannels({x, y}, deltaZDesc)[0];
                    Float dzdy = 8 * in.GetChannels({x, y}, deltaZDesc)[1];

                    ImageChannelValues nChan = in.GetChannels({x, y}, nDesc);
                    Normal3f n = Normal3f(nChan[0], nChan[1], nChan[2]);
                    if (n == Normal3f(0, 0, 0))
                        // background pixel
                        continue;

                    Float pixelVariance = varianceImage.GetChannel({x, y}, 0);
                    float result[3] = {0.f};
                    float wpSum = 0, wnSum = 0, wcSum = 0;
                    // if (pixelVariance > .001) {
                    // pixelVariance = std::max<Float>(pixelVariance,
                    // .000001); {
                    {
                        // Higher sigma -> more blur
                        // Float sigma_y = .05;
                        Float sigma_z = .005;

                        // sigma_y = pixelVariance * 50;
                        // sigma_y = std::sqrt(std::sqrt(pixelVariance)) *
                        // 10 * sigmaYScale;

                        for (int dy = -halfWidth * delta; dy <= halfWidth * delta;
                             dy += delta) {
                            if (y + dy < 0 || y + dy >= currentImage.Resolution().y)
                                continue;
                            for (int dx = -halfWidth * delta; dx <= halfWidth * delta;
                                 dx += delta) {
                                if (x + dx < 0 || x + dx >= currentImage.Resolution().x)
                                    continue;
                                ImageChannelValues co =
                                    currentImage.GetChannels({x + dx, y + dy});
                                Float dc2 = (Sqr(c[0] - co[0]) + Sqr(c[1] - co[1]) +
                                             Sqr(c[2] - co[2]));  // squared color
                                                                  // difference
                                Float otherVariance =
                                    varianceImage.GetChannel({x + dx, y + dy}, 0);
                                Float d2 =
                                    std::max<Float>(0, dc2 - (pixelVariance +
                                                              std::min(pixelVariance,
                                                                       otherVariance))) /
                                    (1e-4 + 0.36f * (pixelVariance + otherVariance));

                                Float zo = in.GetChannels({x + dx, y + dy}, zDesc);
                                ImageChannelValues noChan =
                                    in.GetChannels({x + dx, y + dy}, nDesc);
                                Normal3f no = Normal3f(noChan[0], noChan[1], noChan[2]);
                                if (no == Normal3f(0, 0, 0))
                                    // background pixel;
                                    continue;

                                Float zp = z + dx * dzdx + dy * dzdy;
                                Float dz = (z - zp) / ((z + zp) * 0.5f);

                                // Assume camera space position...
                                Float wp = Gaussian(dz, 0, sigma_z) *
                                           f[std::abs(dy / delta)] *
                                           f[std::abs(dx / delta)];
                                Float wn = Pow<32>(std::max<float>(0, Dot(n, no)));
                                Float wc =
                                    FastExp(-d2 / 90);  // Gaussian(dc, 0, sigma_y);
                                CHECK(!std::isnan(wc));
                                wpSum += wp;
                                wnSum += wn;
                                wcSum += wc;
                                Float w = wp * wn * wc;

                                // CO fprintf(stderr, "(%d, %d) dc2 %f var
                                // %f other var %f -> d2 %f\n", CO x, y,
                                // dc2, pixelVariance, otherVariance, d2);

                                CHECK(!std::isnan(w));
                                if (w == 0)
                                    continue;

                                for (int c = 0; c < 3; ++c) {
                                    result[c] +=
                                        w * currentImage.GetChannel({x + dx, y + dy}, c);
                                    CHECK(!std::isnan(result[c]));
                                }
                                wsum += w;
                            }
                        }
                    }
                    for (int c = 0; c < 3; ++c)
                        if (wsum > 0) {
                            filtered.SetChannel({x, y}, c, result[c] / wsum);
                            // wImage.SetChannels({x, y}, {wpSum, wnSum,
                            // wcSum});
                        } else
                            filtered.SetChannel({x, y}, c,
                                                currentImage.GetChannel({x, y}, c));
                }
            }
        });

        // filtered.Write(StringPrintf("filtered-%d-%d.exr", call, i));
        // wImage.Write(StringPrintf("weights%d.exr", i));
        //        if (i == 0)
        //  dzImage.Write("dz.exr");

        pstd::swap(filtered, currentImage);
    }

    // static int i = 0;
    // currentImage.Write(StringPrintf("filteredillum-%d.exr", i++));

    // reincorporate albedo
    for (int y = 0; y < currentImage.Resolution().y; ++y)
        for (int x = 0; x < currentImage.Resolution().x; ++x) {
            ImageChannelValues albedo = in.GetChannels({x, y}, albedoDesc);
            for (int c = 0; c < 3; ++c)
                currentImage.SetChannel({x, y}, c,
                                        currentImage.GetChannel({x, y}, c) * albedo[c]);
        }

    return currentImage;
}